

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::parseInto
          (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,int argc,char **argv,
          ConfigData *config)

{
  IArgFunction<Catch::ConfigData> *pIVar1;
  long lVar2;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> tokens;
  Parser parser;
  string processName;
  
  std::__cxx11::string::string((string *)&processName,*argv,(allocator *)&parser);
  lVar2 = std::__cxx11::string::find_last_of((char *)&processName,0x1541d7);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&parser,(ulong)&processName);
    std::__cxx11::string::operator=((string *)&processName,(string *)&parser);
    std::__cxx11::string::~string((string *)&parser);
  }
  pIVar1 = (this->m_boundProcessName).functionObj;
  (*pIVar1->_vptr_IArgFunction[2])(pIVar1,config,&processName);
  tokens.
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tokens.
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tokens.
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Parser::Parser(&parser);
  Parser::parseIntoTokens(&parser,argc,argv,&tokens);
  populate(__return_storage_ptr__,this,&tokens,config);
  std::__cxx11::string::~string((string *)&parser);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::~vector
            (&tokens);
  std::__cxx11::string::~string((string *)&processName);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Parser::Token> parseInto( int argc, char const * const * argv, ConfigT& config ) const {
            std::string processName = argv[0];
            std::size_t lastSlash = processName.find_last_of( "/\\" );
            if( lastSlash != std::string::npos )
                processName = processName.substr( lastSlash+1 );
            m_boundProcessName.set( config, processName );
            std::vector<Parser::Token> tokens;
            Parser parser;
            parser.parseIntoTokens( argc, argv, tokens );
            return populate( tokens, config );
        }